

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O2

void __thiscall
Assimp::SMDImporter::ParseVertex
          (SMDImporter *this,char *szCurrent,char **szCurrentOut,Vertex *vertex,bool bVASection)

{
  bool bVar1;
  char *msg;
  SMDImporter *pSVar2;
  pointer out;
  uint iSize;
  undefined1 local_48 [16];
  value_type local_38;
  
  pSVar2 = (SMDImporter *)local_48;
  local_48._0_8_ = szCurrent;
  bVar1 = SkipSpaces<char>((char **)local_48);
  if (((bVar1) && (*(byte *)local_48._0_8_ < 0xe)) &&
     ((0x3401U >> (*(byte *)local_48._0_8_ & 0x1f) & 1) != 0)) {
    SkipSpacesAndLineEnd(this,(char *)local_48._0_8_,(char **)local_48);
    ParseVertex(this,(char *)local_48._0_8_,szCurrentOut,vertex,bVASection);
    return;
  }
  bVar1 = ParseSignedInt(pSVar2,(char *)local_48._0_8_,(char **)local_48,(int *)&vertex->iParentNode
                        );
  if (bVar1) {
    bVar1 = ParseFloat(pSVar2,(char *)local_48._0_8_,(char **)local_48,(float *)vertex);
    if (bVar1) {
      bVar1 = ParseFloat(pSVar2,(char *)local_48._0_8_,(char **)local_48,&(vertex->pos).y);
      if (bVar1) {
        bVar1 = ParseFloat(pSVar2,(char *)local_48._0_8_,(char **)local_48,&(vertex->pos).z);
        if (bVar1) {
          bVar1 = ParseFloat(pSVar2,(char *)local_48._0_8_,(char **)local_48,&(vertex->nor).x);
          if (bVar1) {
            bVar1 = ParseFloat(pSVar2,(char *)local_48._0_8_,(char **)local_48,&(vertex->nor).y);
            if (bVar1) {
              bVar1 = ParseFloat(pSVar2,(char *)local_48._0_8_,(char **)local_48,&(vertex->nor).z);
              if (bVar1) {
                if (bVASection) goto LAB_005414b0;
                bVar1 = ParseFloat(pSVar2,(char *)local_48._0_8_,(char **)local_48,&(vertex->uv).x);
                if (bVar1) {
                  bVar1 = ParseFloat(pSVar2,(char *)local_48._0_8_,(char **)local_48,&(vertex->uv).y
                                    );
                  if (bVar1) {
                    local_48._12_4_ = 0;
                    bVar1 = ParseUnsignedInt(pSVar2,(char *)local_48._0_8_,(char **)local_48,
                                             (uint *)(local_48 + 0xc));
                    if (bVar1) {
                      pSVar2 = (SMDImporter *)&vertex->aiBoneLinks;
                      local_38.first = 0;
                      local_38.second = 0.0;
                      std::
                      vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      ::resize((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                *)pSVar2,(ulong)(uint)local_48._12_4_,&local_38);
                      out = (vertex->aiBoneLinks).
                            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                      do {
                        if ((out == (vertex->aiBoneLinks).
                                    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish) ||
                           (bVar1 = ParseUnsignedInt(pSVar2,(char *)local_48._0_8_,(char **)local_48
                                                     ,&out->first), !bVar1)) break;
                        bVar1 = ParseFloat(pSVar2,(char *)local_48._0_8_,(char **)local_48,
                                           &out->second);
                        out = out + 1;
                      } while (bVar1);
                    }
                    goto LAB_005414b0;
                  }
                  msg = "Unexpected EOF/EOL while parsing vertex.uv.y";
                }
                else {
                  msg = "Unexpected EOF/EOL while parsing vertex.uv.x";
                }
              }
              else {
                msg = "Unexpected EOF/EOL while parsing vertex.nor.z";
              }
            }
            else {
              msg = "Unexpected EOF/EOL while parsing vertex.nor.y";
            }
          }
          else {
            msg = "Unexpected EOF/EOL while parsing vertex.nor.x";
          }
        }
        else {
          msg = "Unexpected EOF/EOL while parsing vertex.pos.z";
        }
      }
      else {
        msg = "Unexpected EOF/EOL while parsing vertex.pos.y";
      }
    }
    else {
      msg = "Unexpected EOF/EOL while parsing vertex.pos.x";
    }
  }
  else {
    msg = "Unexpected EOF/EOL while parsing vertex.parent";
  }
  LogErrorNoThrow(this,msg);
LAB_005414b0:
  SkipLine(this,(char *)local_48._0_8_,(char **)local_48);
  *szCurrentOut = (char *)local_48._0_8_;
  return;
}

Assistant:

void SMDImporter::ParseVertex(const char* szCurrent,
        const char** szCurrentOut, SMD::Vertex& vertex,
        bool bVASection /*= false*/) {
    if (SkipSpaces(&szCurrent) && IsLineEnd(*szCurrent)) {
        SkipSpacesAndLineEnd(szCurrent,&szCurrent);
        return ParseVertex(szCurrent,szCurrentOut,vertex,bVASection);
    }
    if(!ParseSignedInt(szCurrent,&szCurrent,(int&)vertex.iParentNode)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.parent");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.pos.x)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.pos.x");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.pos.y)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.pos.y");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.pos.z)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.pos.z");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.nor.x)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.nor.x");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.nor.y)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.nor.y");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.nor.z)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.nor.z");
        SMDI_PARSE_RETURN;
    }

    if (bVASection) {
        SMDI_PARSE_RETURN;
    }

    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.uv.x)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.uv.x");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.uv.y)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.uv.y");
        SMDI_PARSE_RETURN;
    }

    // now read the number of bones affecting this vertex
    // all elements from now are fully optional, we don't need them
    unsigned int iSize = 0;
    if(!ParseUnsignedInt(szCurrent,&szCurrent,iSize)) {
        SMDI_PARSE_RETURN;
    }
    vertex.aiBoneLinks.resize(iSize,std::pair<unsigned int, float>(0,0.0f));

    for (std::vector<std::pair<unsigned int, float> >::iterator
            i =  vertex.aiBoneLinks.begin();
            i != vertex.aiBoneLinks.end();++i) {
        if(!ParseUnsignedInt(szCurrent,&szCurrent,(*i).first)) {
            SMDI_PARSE_RETURN;
        }
        if(!ParseFloat(szCurrent,&szCurrent,(*i).second)) {
            SMDI_PARSE_RETURN;
        }
    }

    // go to the beginning of the next line
    SMDI_PARSE_RETURN;
}